

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSynth.c
# Opt level: O3

int Gia_TransferMappedClasses(Gia_Man_t *pPart,int *pMapBack,int *pReprs)

{
  int iVar1;
  int iVar2;
  Gia_Rpr_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  
  pGVar3 = pPart->pReprs;
  iVar6 = 0;
  if ((pGVar3 != (Gia_Rpr_t *)0x0) && (uVar9 = pPart->nObjs, iVar6 = 0, 0 < (int)uVar9)) {
    pGVar4 = pPart->pObjs;
    lVar8 = 0;
    iVar6 = 0;
    do {
      if (pGVar4 == (Gia_Obj_t *)0x0) {
        return 0;
      }
      uVar7 = (ulong)(uint)pGVar3[lVar8] & 0xfffffff;
      if (uVar7 != 0xfffffff) {
        if (uVar9 <= (uint)uVar7) {
          __assert_fail("Gia_ObjRepr(pPart, i) < Gia_ManObjNum(pPart)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSynth.c"
                        ,0xd8,"int Gia_TransferMappedClasses(Gia_Man_t *, int *, int *)");
        }
        iVar1 = pMapBack[lVar8];
        iVar2 = pMapBack[uVar7];
        if (iVar1 != iVar2) {
          iVar5 = iVar2;
          if (iVar2 < iVar1) {
            iVar5 = iVar1;
          }
          if (iVar1 < iVar2) {
            iVar2 = iVar1;
          }
          pReprs[iVar5] = iVar2;
          iVar6 = iVar6 + 1;
          uVar9 = pPart->nObjs;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)uVar9);
  }
  return iVar6;
}

Assistant:

int Gia_TransferMappedClasses( Gia_Man_t * pPart, int * pMapBack, int * pReprs )
{
    Gia_Obj_t * pObj;
    int i, Id1, Id2, nClasses;
    if ( pPart->pReprs == NULL ) 
        return 0;
    nClasses = 0;
    Gia_ManForEachObj( pPart, pObj, i )
    {
        if ( Gia_ObjRepr(pPart, i) == GIA_VOID )
            continue;
        assert( i                     < Gia_ManObjNum(pPart) );
        assert( Gia_ObjRepr(pPart, i) < Gia_ManObjNum(pPart) );
        Id1 = pMapBack[ i ];
        Id2 = pMapBack[ Gia_ObjRepr(pPart, i) ];
        if ( Id1 == Id2 )
            continue;
        if ( Id1 < Id2 )
            pReprs[Id2] = Id1;
        else
            pReprs[Id1] = Id2;
        nClasses++;
    }
    return nClasses;
}